

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op2d.h
# Opt level: O0

void __thiscall
PeltResult<float,_float>::PeltResult
          (PeltResult<float,_float> *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *cp,
          vector<float,_std::allocator<float>_> *x,vector<float,_std::allocator<float>_> *y,
          double cost)

{
  double cost_local;
  vector<float,_std::allocator<float>_> *y_local;
  vector<float,_std::allocator<float>_> *x_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *cp_local;
  PeltResult<float,_float> *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->cp,cp);
  std::vector<float,_std::allocator<float>_>::vector(&this->x,x);
  std::vector<float,_std::allocator<float>_>::vector(&this->y,y);
  this->cost = cost;
  return;
}

Assistant:

PeltResult(){}